

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O2

void __thiscall Linker::FixupCallMicrocode(Linker *this,uint microcode,uint oldGlobalSize)

{
  FastVector<unsigned_int,_false,_false> *this_00;
  uint *puVar1;
  uint *puVar2;
  ExternModuleInfo *pEVar3;
  uint uVar4;
  uint uVar5;
  
  this_00 = &this->exRegVmConstants;
  while (uVar4 = microcode,
        puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar4), *puVar1 != 1) {
    puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar4);
    microcode = uVar4 + 1;
    switch(*puVar1) {
    case 2:
    case 3:
    case 4:
    case 5:
      microcode = uVar4 + 2;
      break;
    case 6:
      puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar4 + 1);
      if (*puVar1 == 0) {
        puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar4 + 2);
        uVar5 = *puVar1;
        if (uVar5 < 0x1000000) {
          uVar5 = uVar5 + oldGlobalSize;
        }
        else {
          puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->moduleRemap,(uVar5 >> 0x18) - 1);
          pEVar3 = FastVector<ExternModuleInfo,_false,_false>::operator[](&this->exModules,*puVar2);
          uVar5 = (uVar5 & 0xffffff) + pEVar3->variableOffset;
        }
        *puVar1 = uVar5;
      }
      microcode = uVar4 + 4;
    }
  }
  uVar4 = uVar4 + 3;
  while (uVar5 = uVar4, puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar5),
        *puVar1 != 7) {
    puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar5);
    if (*puVar1 - 8 < 2) {
      uVar4 = uVar5 + 2;
    }
    else {
      uVar4 = uVar5 + 1;
      if (*puVar1 == 10) {
        puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar5 + 1);
        if (*puVar1 == 0) {
          puVar1 = FastVector<unsigned_int,_false,_false>::operator[](this_00,uVar5 + 2);
          uVar4 = *puVar1;
          if (uVar4 < 0x1000000) {
            uVar4 = uVar4 + oldGlobalSize;
          }
          else {
            puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                               (&this->moduleRemap,(uVar4 >> 0x18) - 1);
            pEVar3 = FastVector<ExternModuleInfo,_false,_false>::operator[]
                               (&this->exModules,*puVar2);
            uVar4 = (uVar4 & 0xffffff) + pEVar3->variableOffset;
          }
          *puVar1 = uVar4;
        }
        uVar4 = uVar5 + 4;
      }
    }
  }
  return;
}

Assistant:

void Linker::FixupCallMicrocode(unsigned microcode, unsigned oldGlobalSize)
{
	while(exRegVmConstants[microcode] != rvmiCall)
	{
		switch(exRegVmConstants[microcode++])
		{
		case rvmiPush:
			microcode++;
			break;
		case rvmiPushQword:
			microcode++;
			break;
		case rvmiPushImm:
			microcode++;
			break;
		case rvmiPushImmq:
			microcode++;
			break;
		case rvmiPushMem:
			if(exRegVmConstants[microcode] == rvrrGlobals)
			{
				unsigned &offset = exRegVmConstants[microcode + 1];

				if(offset >> 24)
					offset = (offset & 0x00ffffff) + exModules[moduleRemap[(offset >> 24) - 1]].variableOffset;
				else
					offset += oldGlobalSize;
			}

			microcode += 3;
			break;
		}
	}

	microcode += 3;

	while(exRegVmConstants[microcode] != rvmiReturn)
	{
		switch(exRegVmConstants[microcode++])
		{
		case rvmiPop:
		case rvmiPopq:
			microcode++;
			break;
		case rvmiPopMem:
			if(exRegVmConstants[microcode] == rvrrGlobals)
			{
				unsigned &offset = exRegVmConstants[microcode + 1];

				if(offset >> 24)
					offset = (offset & 0x00ffffff) + exModules[moduleRemap[(offset >> 24) - 1]].variableOffset;
				else
					offset += oldGlobalSize;
			}

			microcode += 3;
			break;
		}
	}
}